

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint ON_SubDEdgeChain::SortEdgesIntoEdgeChains
               (ON_SimpleArray<ON_SubDEdgePtr> *unsorted_edges,uint minimum_chain_length,
               ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges,bool bIgnoreCorners)

{
  byte bVar1;
  char cVar2;
  ON_SubDEdgePtr *pOVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint *puVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  uint i;
  ulong uVar16;
  ON_SubDEdgePtrLink *pOVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  ON_SubDEdgePtrLink local_d8;
  ulong local_c8;
  ON_SubDVertex *local_c0;
  ulong local_b8;
  ulong local_b0;
  ON_SimpleArray<ON_SubDEdgePtr> chain;
  ON_SimpleArray<ON_SubDEdgePtrLink> links;
  ON_SimpleArray<ON_SubDEdgePtr> tail;
  ON_SubDEdgePtrLink epl1;
  
  uVar8 = (ulong)(uint)unsorted_edges->m_count;
  if (uVar8 == 0) {
    local_c8._0_4_ = 0;
    if (-1 < sorted_edges->m_capacity) {
      sorted_edges->m_count = 0;
    }
  }
  else {
    ON_SimpleArray<ON_SubDEdgePtrLink>::ON_SimpleArray
              (&links,(ulong)(uint)(unsorted_edges->m_count * 2));
    local_d8.m_ep = (ON_SubDEdgePtr)0;
    local_d8.m_index = 0;
    local_d8.m_nbr_index = 0xffffffff;
    for (uVar16 = 0; uVar8 != uVar16; uVar16 = uVar16 + 1) {
      uVar12 = unsorted_edges->m_a[uVar16].m_ptr;
      uVar7 = uVar12 & 0xfffffffffffffff8;
      if (((uVar7 != 0) && (*(long *)(uVar7 + 0x80) != 0)) &&
         (*(long *)(uVar7 + 0x80) != *(long *)(uVar7 + 0x88) && *(long *)(uVar7 + 0x88) != 0)) {
        local_d8.m_ep.m_ptr = uVar12 & 0xfffffffffffffff9 ^ 1;
        ON_SimpleArray<ON_SubDEdgePtrLink>::Append(&links,&local_d8);
        local_d8.m_ep.m_ptr = uVar12;
        local_d8.m_index = local_d8.m_index + 1;
        ON_SimpleArray<ON_SubDEdgePtrLink>::Append(&links,&local_d8);
        local_d8.m_index = local_d8.m_index + 1;
      }
    }
    if (-1 < sorted_edges->m_capacity) {
      sorted_edges->m_count = 0;
    }
    ON_SimpleArray<ON_SubDEdgePtr>::Reserve(sorted_edges,uVar8);
    ON_SimpleArray<ON_SubDEdgePtrLink>::QuickSort(&links,ON_SubDEdgePtrLink::CompareVertex);
    local_b0 = (ulong)(uint)links.m_count;
    uVar16 = 0;
    while( true ) {
      if ((uint)local_b0 <= (uint)uVar16) break;
      uVar12 = links.m_a[uVar16].m_ep.m_ptr;
      uVar7 = uVar12 & 0xfffffffffffffff8;
      if (uVar7 == 0) {
        local_c0 = (ON_SubDVertex *)0x0;
      }
      else {
        local_c0 = *(ON_SubDVertex **)(uVar7 + 0x80 + (ulong)((uint)uVar12 & 1) * 8);
      }
      pOVar17 = links.m_a + uVar16;
      uVar13 = (uint)uVar16 + 1;
      uVar12 = (ulong)uVar13;
      uVar6 = uVar13;
      if (uVar13 < (uint)local_b0) {
        uVar6 = (uint)local_b0;
      }
      local_b8 = CONCAT44(local_b8._4_4_,uVar6);
      lVar15 = uVar12 << 4;
      uVar7 = uVar12;
      local_c8 = uVar16;
      while ((uVar4 = local_b8, uVar7 < local_b0 &&
             (iVar5 = ON_SubDEdgePtrLink::CompareVertex
                                (pOVar17,(ON_SubDEdgePtrLink *)
                                         ((long)&((links.m_a)->m_ep).m_ptr + lVar15)), uVar4 = uVar7
             , iVar5 == 0))) {
        uVar7 = uVar7 + 1;
        lVar15 = lVar15 + 0x10;
      }
      uVar7 = uVar4 & 0xffffffff;
      uVar6 = (uint)uVar4;
      if (local_c0 == (ON_SubDVertex *)0x0) {
        ON_SubDIncrementErrorCount();
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                   ,0x6a48,"","Bug in code that creates the links[] array.");
        uVar16 = uVar7;
      }
      else if ((bIgnoreCorners) || (local_c0->m_vertex_tag != Corner)) {
        if (uVar13 == uVar6) {
          pOVar17->m_nbr_index = 0xfffffffe;
          uVar16 = uVar7;
        }
        else if ((int)local_c8 + 2U == uVar6) {
          pOVar17->m_nbr_index = links.m_a[uVar12].m_index;
          links.m_a[uVar12].m_nbr_index = pOVar17->m_index;
          uVar16 = uVar7;
        }
        else {
          ON_SubDEdgePtrLink::Resolve3OrMoreEdges
                    (0xfffffffe,uVar6 - (int)local_c8,local_c0,links.m_a + uVar16);
          uVar16 = uVar7;
        }
      }
      else {
        puVar9 = &links.m_a[uVar16].m_nbr_index;
        for (uVar12 = uVar16; uVar16 = uVar7, uVar12 < uVar7; uVar12 = uVar12 + 1) {
          *puVar9 = 0xfffffffe;
          puVar9 = puVar9 + 4;
        }
      }
    }
    ON_SimpleArray<ON_SubDEdgePtrLink>::QuickSort(&links,ON_SubDEdgePtrLink::CompareIndex);
    ON_SimpleArray<ON_SubDEdgePtr>::ON_SimpleArray(&chain,uVar8);
    uVar8 = 0;
    local_c8 = local_c8 & 0xffffffff00000000;
    while( true ) {
      if ((uint)local_b0 <= (uint)uVar8) break;
      uVar16 = links.m_a[uVar8].m_ep.m_ptr;
      uVar12._0_4_ = links.m_a[uVar8].m_index;
      uVar12._4_4_ = links.m_a[uVar8].m_nbr_index;
      links.m_a[uVar8].m_ep.m_ptr = 0;
      uVar6 = (uint)uVar8 | 1;
      pOVar17 = links.m_a + uVar6;
      epl1.m_ep.m_ptr = (pOVar17->m_ep).m_ptr;
      epl1.m_index = pOVar17->m_index;
      epl1.m_nbr_index = pOVar17->m_nbr_index;
      links.m_a[uVar6].m_ep.m_ptr = 0;
      if (7 < uVar16) {
        local_d8.m_ep.m_ptr = epl1.m_ep.m_ptr;
        local_d8._8_8_ = epl1._8_8_;
        local_b8 = uVar8;
        if (-1 < chain.m_capacity) {
          chain.m_count = 0;
        }
        while( true ) {
          uVar8 = (ulong)local_d8.m_nbr_index;
          if (0x7ffffffe < local_d8.m_nbr_index >> 1) break;
          uVar6 = (-(local_d8.m_nbr_index & 1) | 1) + local_d8.m_nbr_index;
          pOVar17 = links.m_a + uVar6;
          local_d8.m_ep.m_ptr = (pOVar17->m_ep).m_ptr;
          local_d8.m_index = pOVar17->m_index;
          local_d8.m_nbr_index = pOVar17->m_nbr_index;
          links.m_a[uVar8].m_ep.m_ptr = 0;
          links.m_a[uVar6].m_ep.m_ptr = 0;
          if (local_d8.m_ep.m_ptr < 8) {
            bVar18 = local_d8.m_nbr_index < 0xfffffffe;
            goto LAB_005f25c1;
          }
          ON_SimpleArray<ON_SubDEdgePtr>::Append(&chain,&local_d8.m_ep);
        }
        bVar18 = false;
LAB_005f25c1:
        bVar19 = chain.m_count != 0;
        bVar20 = local_d8.m_index == epl1.m_index;
        local_c0 = (ON_SubDVertex *)CONCAT71(local_c0._1_7_,bVar20 && bVar19);
        bVar21 = false;
        if ((!bVar20 || !bVar19) && (bVar21 = false, !bVar18)) {
          bVar21 = (local_d8._8_8_ & 1) == 0;
        }
        if (!bVar20 || !bVar19) {
          ON_SimpleArray<ON_SubDEdgePtr>::Reverse(&chain);
        }
        ON_SimpleArray<ON_SubDEdgePtr>::Append(&chain,&epl1.m_ep);
        if ((byte)local_c0 == '\0') {
          uVar8 = uVar12 >> 0x20;
          local_d8.m_ep.m_ptr = uVar16;
          local_d8._8_8_ = uVar12;
          while (uVar6 = (uint)uVar8, uVar6 < 0xfffffffe) {
            uVar6 = (-(uVar6 & 1) | 1) + uVar6;
            pOVar17 = links.m_a + uVar6;
            local_d8.m_ep.m_ptr = (pOVar17->m_ep).m_ptr;
            local_d8.m_index = pOVar17->m_index;
            local_d8.m_nbr_index = pOVar17->m_nbr_index;
            links.m_a[uVar8].m_ep.m_ptr = 0;
            links.m_a[uVar6].m_ep.m_ptr = 0;
            if (local_d8.m_ep.m_ptr < 8) break;
            tail._vptr_ON_SimpleArray = (_func_int **)(local_d8.m_ep.m_ptr & 0xfffffffffffffff9 ^ 1)
            ;
            ON_SimpleArray<ON_SubDEdgePtr>::Append(&chain,(ON_SubDEdgePtr *)&tail);
            uVar8 = (ulong)local_d8._8_8_ >> 0x20;
          }
          if ((bool)(bVar21 & (local_d8._8_8_ & 1) == 0)) {
            ReverseEdgeChain(&chain);
          }
        }
        else {
          ON_SimpleArray<ON_SubDEdgePtr>::Reverse(&chain);
        }
        iVar5 = chain.m_count;
        uVar16 = (ulong)(uint)chain.m_count;
        uVar8 = local_b8;
        if (uVar16 != 0) {
          if (2 < (uint)chain.m_count) {
            uVar8 = (chain.m_a)->m_ptr & 0xfffffffffffffff8;
            if (((uVar8 != 0) &&
                (lVar15 = *(long *)(uVar8 + 0x80 + (ulong)((uint)(chain.m_a)->m_ptr & 1) * 8),
                lVar15 != 0)) && (*(char *)(lVar15 + 0x60) != '\x03')) {
              uVar12 = chain.m_a[chain.m_count - 1].m_ptr & 0xfffffffffffffff8;
              if ((uVar12 != 0) &&
                 (lVar15 == *(long *)(uVar12 + 0x80 +
                                     (ulong)(~(uint)chain.m_a[chain.m_count - 1].m_ptr & 1) * 8))) {
                cVar2 = *(char *)(uVar8 + 0x60);
                bVar18 = cVar2 == '\x01' || cVar2 == '\x04';
                if ((bVar18 == (*(char *)(uVar12 + 0x60) == '\x04' ||
                               *(char *)(uVar12 + 0x60) == '\x01')) &&
                   (((cVar2 != '\x04' && (cVar2 != '\x01')) || (*(char *)(lVar15 + 0x60) != '\x02'))
                   )) {
                  lVar15 = 8;
                  uVar8 = 1;
LAB_005f28c4:
                  if (uVar8 <= uVar16 && uVar16 - uVar8 != 0) {
                    uVar12 = chain.m_a[uVar8].m_ptr & 0xfffffffffffffff8;
                    if ((uVar12 != 0) &&
                       (lVar11 = *(long *)(uVar12 + 0x80 +
                                          (ulong)((uint)chain.m_a[uVar8].m_ptr & 1) * 8),
                       lVar11 != 0)) {
                      if ((bVar18 == (*(char *)(uVar12 + 0x60) == '\x04' ||
                                     *(char *)(uVar12 + 0x60) == '\x01')) &&
                         (((cVar2 != '\x04' && (cVar2 != '\x01')) ||
                          ((*(byte *)(lVar11 + 0x60) & 0xfe) != 2)))) goto LAB_005f291e;
                      tail._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00828dd8;
                      tail.m_a = (ON_SubDEdgePtr *)0x0;
                      tail.m_count = 0;
                      tail.m_capacity = 0;
                      ON_SimpleArray<ON_SubDEdgePtr>::Append(&tail,(int)uVar8,chain.m_a);
                      for (lVar11 = 0; lVar11 + uVar8 < uVar16; lVar11 = lVar11 + 1) {
                        chain.m_a[lVar11].m_ptr =
                             *(ON__UINT_PTR *)((long)&chain.m_a[lVar11].m_ptr + lVar15);
                      }
                      iVar14 = (int)(uVar16 - uVar8);
                      if ((-1 < iVar14) && (iVar14 <= chain.m_capacity)) {
                        chain.m_count = iVar14;
                      }
                      ON_SimpleArray<ON_SubDEdgePtr>::Append(&chain,tail.m_count,tail.m_a);
                      ON_SimpleArray<ON_SubDEdgePtr>::~ON_SimpleArray(&tail);
                    }
                  }
                }
              }
            }
          }
          uVar8 = local_b8;
          if (minimum_chain_length <= (uint)chain.m_count) {
            uVar16 = (chain.m_a)->m_ptr & 0xfffffffffffffff8;
            if (uVar16 == 0) {
              lVar15 = 0;
            }
            else {
              lVar15 = *(long *)(uVar16 + 0x80 + (ulong)((uint)(chain.m_a)->m_ptr & 1) * 8);
            }
            iVar14 = sorted_edges->m_count;
            pOVar3 = sorted_edges->m_a;
            if (pOVar3 + (long)iVar14 + -1 == (ON_SubDEdgePtr *)0x0 || (long)iVar14 < 1) {
LAB_005f27d7:
              lVar11 = 0;
            }
            else {
              uVar16 = pOVar3[(long)iVar14 + -1].m_ptr;
              uVar12 = uVar16 & 0xfffffffffffffff8;
              if (uVar12 == 0) goto LAB_005f27d7;
              lVar11 = *(long *)(uVar12 + 0x80 + (ulong)(~(uint)uVar16 & 1) * 8);
            }
            if ((lVar15 == 0) || (lVar15 != lVar11)) {
              ON_SimpleArray<ON_SubDEdgePtr>::Append(sorted_edges,chain.m_count,chain.m_a);
              local_c8 = CONCAT44(local_c8._4_4_,(uint)local_c8 + 1);
            }
            else {
              uVar16 = chain.m_a[iVar5 - 1].m_ptr & 0xfffffffffffffff8;
              if (uVar16 == 0) {
                lVar11 = 0;
              }
              else {
                lVar11 = *(long *)(uVar16 + 0x80 +
                                  (ulong)(~(uint)chain.m_a[iVar5 - 1].m_ptr & 1) * 8);
              }
              if (pOVar3 == (ON_SubDEdgePtr *)0x0 || iVar14 < 1) {
LAB_005f2865:
                lVar10 = 0;
              }
              else {
                uVar16 = pOVar3->m_ptr & 0xfffffffffffffff8;
                if (uVar16 == 0) goto LAB_005f2865;
                lVar10 = *(long *)(uVar16 + 0x80 + (ulong)((uint)pOVar3->m_ptr & 1) * 8);
              }
              if (lVar11 == lVar10) {
                bVar1 = (byte)local_c0 | lVar11 == lVar15;
                local_c0 = (ON_SubDVertex *)CONCAT71(local_c0._1_7_,bVar1);
                if (bVar1 != 0) {
                  ON_SimpleArray<ON_SubDEdgePtr>::Append(sorted_edges,chain.m_count,chain.m_a);
                  goto LAB_005f2817;
                }
                ReverseEdgeChain(&chain);
                ON_SimpleArray<ON_SubDEdgePtr>::Append(sorted_edges,chain.m_count,chain.m_a);
              }
              else {
                ON_SimpleArray<ON_SubDEdgePtr>::Prepend(sorted_edges,chain.m_count,chain.m_a);
              }
              local_c8 = CONCAT44(local_c8._4_4_,(uint)local_c8 + 1);
            }
          }
        }
LAB_005f2817:
        if ((uint)local_b0 == sorted_edges->m_count * 2) break;
      }
      uVar8 = (ulong)((int)uVar8 + 2);
    }
    ON_SimpleArray<ON_SubDEdgePtr>::~ON_SimpleArray(&chain);
    ON_SimpleArray<ON_SubDEdgePtrLink>::~ON_SimpleArray(&links);
  }
  return (uint)local_c8;
LAB_005f291e:
  uVar8 = uVar8 + 1;
  lVar15 = lVar15 + 8;
  goto LAB_005f28c4;
}

Assistant:

unsigned int ON_SubDEdgeChain::SortEdgesIntoEdgeChains(
  const ON_SimpleArray< ON_SubDEdgePtr >& unsorted_edges,
  unsigned int minimum_chain_length,
  ON_SimpleArray< ON_SubDEdgePtr >& sorted_edges,
  const bool bIgnoreCorners
)
{
  // NOTE:
  //  unsorted_edges[] and sorted_edges[] may reference the same array.
  ////const ON_SubDEdge* ee[2] = {};
  ////const ON_SubDVertex* vv[2] = {};

  const unsigned int unsorted_edge_count = unsorted_edges.Count();
  if (unsorted_edge_count <= 0)
  {
    sorted_edges.SetCount(0);
    return 0;
  }

  ON_SimpleArray< ON_SubDEdgePtrLink > links(2*unsorted_edge_count);
  const unsigned int unset_nbr1_index = 0xFFFFFFFEU;
  const unsigned int unset_nbrX_index = unset_nbr1_index+1;
  ON_SubDEdgePtrLink epl;
  epl.m_nbr_index = unset_nbrX_index;
  for (unsigned int i = 0; i < unsorted_edge_count; i++)
  {
    ON_SubDEdgePtr ep = unsorted_edges[i];
    const ON_SubDEdge* e = ep.Edge();
    if (nullptr == e || nullptr == e->m_vertex[0] || nullptr == e->m_vertex[1] || e->m_vertex[0] == e->m_vertex[1])
      continue;

    // unsorted_edges[i] has 2 links with m_index = 2*i and m_index = 2*+1.

    // links with even m_index have opposite orientation as unsorted_edges[].
    // links[2*i].m_ep.RelativeVertex(0) = unsorted_edges[i].RelativeVertex(1)
    epl.m_ep = ep.Reversed();
    links.Append(epl);
    ++epl.m_index;
    ////ee[0] = epl.m_ep.Edge();
    ////vv[1] = epl.m_ep.RelativeVertex(0);

    // links with odd m_index have same orientation as unsorted_edges[].
    // links[2*i+1].m_ep.RelativeVertex(0) = unsorted_edges[i].RelativeVertex(0)
    epl.m_ep = ep;
    links.Append(epl);
    ++epl.m_index;
    ////ee[1] = epl.m_ep.Edge();
    ////vv[0] = epl.m_ep.RelativeVertex(0);
    ////if (e != ee[0] || e != ee[1] || vv[0] == vv[1])
    ////  return false;
  }

  // NOTE:
  // unsorted_edges[] and sorted_edges[] may reference the same array.
  // At this point, I'm finished with unsorted_edges[] so it's ok to 
  // modify sorted_edges[] here.
  sorted_edges.SetCount(0);
  sorted_edges.Reserve(unsorted_edge_count);

  // sort links by ON_SubDEdgePtr.RelativeVertex(0) and set m_nbr_index
  links.QuickSort(ON_SubDEdgePtrLink::CompareVertex);
  // link_count = even number
  const unsigned int link_count = links.UnsignedCount();
  unsigned int i1 = link_count;
  for (unsigned int i0 = 0; i0 < link_count; i0 = i1)
  {
    ON_SubDEdgePtrLink& epl0 = links[i0];
    const ON_SubDVertex* v = epl0.m_ep.RelativeVertex(0);
    for (i1 = i0 + 1; i1 < link_count; ++i1)
    {
      if (0 != ON_SubDEdgePtrLink::CompareVertex(&epl0, &links[i1]))
        break;
    }
    if (nullptr == v)
    {
      ON_SUBD_ERROR("Bug in code that creates the links[] array.");
      continue;
    }
    if (!bIgnoreCorners)
    {
      if (v->IsCorner())
      {
        // These edges will be at the ends of chains.
        while (i0 < i1)
          links[i0++].m_nbr_index = unset_nbr1_index;
        continue;
      }
    }

    if (i0 + 1 == i1)
    {
      // The vertex is referenced by exactly 1 edge in unsorted_edges[]
      // This edge will appear in sorted_edges[] at the start or end of a chain.
      epl0.m_nbr_index = unset_nbr1_index;
      continue; 
    }
    if (i0 + 2 == i1)
    {
      // This vertex is referenced by exactly 2 edges in  unsorted_edges[].
      // The vertex will be in the interior of a chain and the edges will 
      // appear in sorted_edges[] next to each other in the same chain.
      ON_SubDEdgePtrLink& epl1 = links[i0 + 1];
      epl0.m_nbr_index = epl1.m_index;
      epl1.m_nbr_index = epl0.m_index;
      continue;
    }

    // The vertex referenced by 3 or more edges in unsorted_edges[].
    // If the case cannot be resolved by Resolve3OrMoreEdges(), 
    // then this vertex will not be in the interior of a chain.
    ON_SubDEdgePtrLink::Resolve3OrMoreEdges(
      unset_nbr1_index,
      i1 - i0,
      v,
      links.Array() + i0
    );
  }

  // Sort links[] by m_index value to restore links[] to its original order.
  links.QuickSort(ON_SubDEdgePtrLink::CompareIndex);
  ON_SubDEdgePtrLink* links_array = links.Array();

  unsigned chain_count = 0;
  ON_SimpleArray<ON_SubDEdgePtr> chain(unsorted_edge_count);

  for (unsigned int i = 0; i < link_count; ++i)
  {
    // epl0 and epl1 are the links for edges[i/2]
    const ON_SubDEdgePtrLink epl0 = links_array[i];
    links_array[i].m_ep = ON_SubDEdgePtr::Null;
    const ON_SubDEdgePtrLink epl1 = links_array[++i];
    links_array[i].m_ep = ON_SubDEdgePtr::Null;

    if (nullptr == epl0.m_ep.Edge())
      continue; // this edge has already been inserted in sorted_edges[].

    chain.SetCount(0);

    // Add edges that come "before" edges[i/2] to chain[]
    epl = epl1;
    for (;;)
    {
      if (epl.m_nbr_index >= unset_nbr1_index)
        break;
      unsigned int j = epl.m_nbr_index;
      unsigned int j1 = (0 == (j % 2)) ? (j + 1) : (j - 1);
      // epl = "previous" link
      epl = links_array[j1];
      links_array[j].m_ep = ON_SubDEdgePtr::Null;
      links_array[j1].m_ep = ON_SubDEdgePtr::Null;
      if (nullptr == epl.m_ep.Edge())
        break;
      ////ee[0] = epl.m_ep.Edge();
      ////vv[0] = epl.m_ep.RelativeVertex(0);
      ////vv[1] = epl.m_ep.RelativeVertex(1);
      ////if (vv[0] == vv[1] || nullptr == ee[0])
      ////  return false;
      chain.Append(epl.m_ep);
    }

    const bool bClosedChain =
        chain.UnsignedCount() > 0 && (epl.m_index == epl1.m_index);
    const bool bFirstEdgeIsReversed = !bClosedChain &&
                                      unset_nbr1_index <= epl.m_nbr_index &&
                                      (0 == (epl.m_index % 2));
    bool bLastEdgeIsReversed{false};
    if (false == bClosedChain)
    {
      chain.Reverse();
    }

    ////ee[0] = epl1.m_ep.Edge();
    ////vv[0] = epl1.m_ep.RelativeVertex(0);
    ////vv[1] = epl1.m_ep.RelativeVertex(1);
    ////if (vv[0] == vv[1] || nullptr == ee[0])
    ////  return false;
    chain.Append(epl1.m_ep); // matches input edge orientation

    if (bClosedChain)
    {
      // put edges[i/2] at the start of the closed chain.
      chain.Reverse();
    }
    else
    {
      // Add edges that come "after" edges[i/2] to chain[]
      epl = epl0;
      for (;;)
      {
        if (epl.m_nbr_index >= unset_nbr1_index)
          break;
        unsigned int j = epl.m_nbr_index;
        unsigned int j1 = (0 == (j % 2)) ? (j + 1) : (j - 1);
        // epl = "next" link
        epl = links_array[j1];
        links_array[j].m_ep = ON_SubDEdgePtr::Null;
        links_array[j1].m_ep = ON_SubDEdgePtr::Null;
        if (nullptr == epl.m_ep.Edge())
          break;
        ////ee[0] = epl.m_ep.Edge();
        ////vv[0] = epl.m_ep.RelativeVertex(1);
        ////vv[1] = epl.m_ep.RelativeVertex(0);
        ////if (vv[0] == vv[1] || nullptr == ee[0])
        ////  return false;
        chain.Append(epl.m_ep.Reversed());
      }

      // No need to update bClosedChain here: if it was closed, then the circle
      // was found with the edges "before" edges[i/2]

      // First and last edge are reversed: reverse chain direction to keep first
      // edge direction the same as in unsorted_edges
      bLastEdgeIsReversed = epl.m_index % 2 == 0;
      if (bFirstEdgeIsReversed && bLastEdgeIsReversed) {
        ReverseEdgeChain(chain);
      }
    }

    const unsigned int chain_edge_count = chain.UnsignedCount();
    if (chain_edge_count > 0)
    {
      for (;;)
      {
        if (chain_edge_count < 3)
          break;
        const ON_SubDVertex* c0 = chain[0].RelativeVertex(0);
        if (nullptr == c0)
          break;
        if (c0->IsCorner())
          break;
        const ON_SubDVertex* c1 = chain[chain_edge_count-1].RelativeVertex(1);
        if (c0 != c1)
          break;
        const ON_SubDEdge* e0 = chain[0].Edge();
        if (nullptr == e0)
          break;
        const ON_SubDEdge* e1 = chain[chain_edge_count-1].Edge();
        if (nullptr == e1)
          break;
        const bool bSmooth = e0->IsSmooth();
        if (bSmooth != e1->IsSmooth())
          break;
        if (bSmooth && c0->IsCrease())
          break;
        // Check for an embedded crease vertex.
        for (unsigned int k = 1; k < chain_edge_count; ++k)
        {
          const ON_SubDVertex* v = chain[k].RelativeVertex(0);
          if (nullptr == v)
            break;
          const ON_SubDEdge* e = chain[k].Edge();
          if (nullptr == e)
            break;
          if (
            bSmooth != e->IsSmooth()
            || (bSmooth && v->IsCreaseOrCorner())
            )
          {
            // shift chain[] so it begins at chain[k];
            ON_SimpleArray<ON_SubDEdgePtr> tail;
            tail.Append(k, chain.Array());
            for (unsigned n = k; n < chain_edge_count; ++n)
              chain[n - k] = chain[n];
            chain.SetCount(chain_edge_count - k);
            chain.Append(tail.Count(), tail.Array());
            break;
          }
        }
        break;
      }
#ifdef ON_DEBUG
      unsigned temp_chain_edge_count{chain_edge_count};
      ON_2udex temp_udex{0U, (unsigned)(chain_edge_count - 1)};
      if (!Internal_VerifyEdgeChain(chain, temp_udex, &temp_chain_edge_count)) {
        temp_chain_edge_count = 0;
      }
      Internal_UnrollChain(chain);
#endif
      if (chain.UnsignedCount() >= minimum_chain_length) {
        const ON_SubDVertex* c0{chain[0].RelativeVertex(0)};
        const ON_SubDVertex* s1{sorted_edges.Last() == nullptr
                                    ? nullptr
                                    : sorted_edges.Last()->RelativeVertex(1)};
        if (c0 != nullptr && c0 == s1) {
          // If the first vertex of the chain is a corner, or a vertex with more
          // than 2 edges referencing it, we might have artificially split the
          // chain at that vertex and the last vertex of the previous chain is
          // the same as ours. Try a few tricks to put a gap between these two
          // vertices.
          const ON_SubDVertex* c1{
              chain[chain_edge_count - 1].RelativeVertex(1)};
          const ON_SubDVertex* s0{
              sorted_edges.First() == nullptr
                  ? nullptr
                  : sorted_edges.First()->RelativeVertex(0)};
          // By order of importance, try to:
          //   - Keep the orientation of the first edge the same as in unsorted_edges
          //   - Not use ReverseEdgeChain()
          //   - Append rather than Prepend to sorted_edges
          if (c1 != s0) {
            ++chain_count;
            sorted_edges.Prepend(chain.Count(), chain.Array());
          } else if (c1 != s1 && !bClosedChain &&
                     ((bFirstEdgeIsReversed && !bLastEdgeIsReversed) ||
                      (!bFirstEdgeIsReversed && bLastEdgeIsReversed))) {
            ReverseEdgeChain(chain);
            ++chain_count;
            sorted_edges.Append(chain.Count(), chain.Array());
          } else if (c0 != s0 && !bClosedChain &&
                     ((bFirstEdgeIsReversed && !bLastEdgeIsReversed) ||
                      (!bFirstEdgeIsReversed && bLastEdgeIsReversed))) {
            ReverseEdgeChain(chain);
            ++chain_count;
            sorted_edges.Prepend(chain.Count(), chain.Array());
          } else if (c1 != s1 && !bClosedChain) {
            ReverseEdgeChain(chain);
            ++chain_count;
            sorted_edges.Append(chain.Count(), chain.Array());
          } else if (c0 != s0 && !bClosedChain) {
            ReverseEdgeChain(chain);
            ++chain_count;
            sorted_edges.Prepend(chain.Count(), chain.Array());
          } else {
            // We tried, but nothing works easily enough: append the chain as
            // usual, this means the two chains are merged and chain_count does
            // not increase.
            sorted_edges.Append(chain.Count(), chain.Array());
          }
        } else {
          ++chain_count;
          sorted_edges.Append(chain.Count(), chain.Array());
        }
      }
    }

    if ( link_count == 2*sorted_edges.UnsignedCount() )
      break; // we've used all the links - no need to "skip over the rest".
  }
#ifdef ON_DEBUG
  Internal_UnrollChain(sorted_edges);
  if (!Internal_CountAndVerifyEdgeChains(sorted_edges, &chain_count)) {
    return chain_count;
  }
#endif
  return chain_count;
}